

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1afm.c
# Opt level: O1

FT_Int t1_get_index(char *name,FT_Offset len,void *user_data)

{
  int iVar1;
  long lVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  FT_Int local_3c;
  
  if ((len < 0x10000) && (iVar1 = *(int *)((long)user_data + 0x188), 0 < (long)iVar1)) {
    lVar2 = *(long *)((long)user_data + 400);
    lVar6 = 0;
    do {
      __s = *(char **)(lVar2 + lVar6 * 8);
      bVar3 = true;
      if ((((__s != (char *)0x0) && (*__s == *name)) && (sVar5 = strlen(__s), sVar5 == len)) &&
         (iVar4 = strncmp(__s,name,len), iVar4 == 0)) {
        bVar3 = false;
        local_3c = (FT_Int)lVar6;
      }
      if (!bVar3) {
        return local_3c;
      }
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  return 0;
}

Assistant:

static FT_Int
  t1_get_index( const char*  name,
                FT_Offset    len,
                void*        user_data )
  {
    T1_Font  type1 = (T1_Font)user_data;
    FT_Int   n;


    /* PS string/name length must be < 16-bit */
    if ( len > 0xFFFFU )
      return 0;

    for ( n = 0; n < type1->num_glyphs; n++ )
    {
      char*  gname = (char*)type1->glyph_names[n];


      if ( gname && gname[0] == name[0]        &&
           ft_strlen( gname ) == len           &&
           ft_strncmp( gname, name, len ) == 0 )
        return n;
    }

    return 0;
  }